

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

uint8 GetCellEdgeIncidenceMask(S2Cell *cell,S2Point *p,double tolerance_uv)

{
  bool bVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  int b;
  undefined4 uVar5;
  undefined4 uVar6;
  R2Point uv;
  R2Rect bound;
  double local_88;
  double adStack_80 [2];
  ostream *local_70;
  R2Rect local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  ostream *local_28;
  ostream *local_20;
  
  local_88 = 0.0;
  adStack_80[0] = 0.0;
  b = (int)cell->face_;
  local_70 = (ostream *)tolerance_uv;
  if (b < 3) {
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,b);
    if (0.0 < dVar2) {
LAB_00209604:
      S2::ValidFaceXYZtoUV(b,p,&local_88,adStack_80);
      local_68.bounds_[0].bounds_.c_[0] = (cell->uv_).bounds_[0].bounds_.c_[0];
      local_68.bounds_[0].bounds_.c_[1] = (cell->uv_).bounds_[0].bounds_.c_[1];
      local_68.bounds_[1].bounds_.c_[0] = (cell->uv_).bounds_[1].bounds_.c_[0];
      local_68.bounds_[1].bounds_.c_[1] = (cell->uv_).bounds_[1].bounds_.c_[1];
      if (FLAGS_s2debug == false) {
        uVar5 = SUB84(local_88,0);
        uVar6 = (undefined4)((ulong)local_88 >> 0x20);
      }
      else {
        local_28 = local_70;
        local_20 = local_70;
        R2Rect::Expanded(&local_68,(R2Point *)&local_28);
        uVar5 = SUB84(local_88,0);
        uVar6 = (undefined4)((ulong)local_88 >> 0x20);
        if ((((local_88 < local_48) || (local_40 < local_88)) || (adStack_80[0] < local_38)) ||
           (local_30 < adStack_80[0])) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                     ,0x400,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_20,"Check failed: bound.Expanded(tolerance_uv).Contains(uv) ",0x38);
          abort();
        }
      }
      bVar1 = ABS(adStack_80[0] - local_68.bounds_[1].bounds_.c_[0]) <= (double)local_70;
      bVar3 = bVar1 + 2;
      if ((double)local_70 < ABS((double)CONCAT44(uVar6,uVar5) - local_68.bounds_[0].bounds_.c_[1]))
      {
        bVar3 = bVar1;
      }
      bVar4 = bVar3 + 4;
      if ((double)local_70 < ABS(adStack_80[0] - local_68.bounds_[1].bounds_.c_[1])) {
        bVar4 = bVar3;
      }
      if (ABS((double)CONCAT44(uVar6,uVar5) - local_68.bounds_[0].bounds_.c_[0]) <= (double)local_70
         ) {
        return bVar4 | 8;
      }
      return bVar4;
    }
  }
  else {
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,b + -3);
    if (dVar2 < 0.0) goto LAB_00209604;
  }
  return '\0';
}

Assistant:

uint8 GetCellEdgeIncidenceMask(const S2Cell& cell, const S2Point& p,
                               double tolerance_uv) {
  uint8 mask = 0;
  R2Point uv;
  if (S2::FaceXYZtoUV(cell.face(), p, &uv)) {
    R2Rect bound = cell.GetBoundUV();
    if (FLAGS_s2debug) S2_DCHECK(bound.Expanded(tolerance_uv).Contains(uv));
    if (fabs(uv[1] - bound[1][0]) <= tolerance_uv) mask |= 1;
    if (fabs(uv[0] - bound[0][1]) <= tolerance_uv) mask |= 2;
    if (fabs(uv[1] - bound[1][1]) <= tolerance_uv) mask |= 4;
    if (fabs(uv[0] - bound[0][0]) <= tolerance_uv) mask |= 8;
  }
  return mask;
}